

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read-demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  int __fd;
  undefined1 local_2d [5];
  size_t sStack_28;
  char buffer [5];
  size_t length;
  int fd;
  char **argv_local;
  int argc_local;
  
  __fd = open("file",0,0x1b6);
  while( true ) {
    sStack_28 = read(__fd,local_2d,5);
    if (sStack_28 == 0) break;
    write(1,local_2d,sStack_28);
  }
  close(__fd);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    int fd = open("file", O_RDONLY, 0666);
    size_t length;
    char buffer[5];
    while((length = read(fd, &buffer[0], 5)) != 0)
    {
        write(1, &buffer[0], length);
    }
    close(fd);

}